

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Importer.cpp
# Opt level: O3

aiScene * __thiscall
Assimp::Importer::ReadFileFromMemory
          (Importer *this,void *pBuffer,size_t pLength,uint pFlags,char *pHint)

{
  pointer pIOHandler;
  IOSystem *pIVar1;
  size_t sVar2;
  IOSystem *pIVar3;
  ImporterPimpl *pIVar4;
  char *__s;
  char fbuff [228];
  char local_118 [232];
  
  __s = "";
  if (pHint != (char *)0x0) {
    __s = pHint;
  }
  if ((pLength != 0 && pBuffer != (void *)0x0) && (sVar2 = strlen(__s), sVar2 < 0xc9)) {
    pIOHandler = (pointer)this->pimpl->mIOHandler;
    this->pimpl->mIOHandler = (IOSystem *)0x0;
    pIVar3 = (IOSystem *)operator_new(0x50);
    (pIVar3->m_pathStack).
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (pIVar3->m_pathStack).
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (pIVar3->m_pathStack).
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    pIVar3->_vptr_IOSystem = (_func_int **)&PTR__MemoryIOSystem_008c8380;
    pIVar3[1]._vptr_IOSystem = (_func_int **)pBuffer;
    pIVar3[1].m_pathStack.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)pLength;
    pIVar3[1].m_pathStack.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = pIOHandler;
    pIVar3[1].m_pathStack.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    pIVar3[2]._vptr_IOSystem = (_func_int **)0x0;
    pIVar3[2].m_pathStack.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    pIVar4 = this->pimpl;
    pIVar1 = pIVar4->mIOHandler;
    if (pIVar1 != pIVar3) {
      if (pIVar1 != (IOSystem *)0x0) {
        (*pIVar1->_vptr_IOSystem[1])();
        pIVar4 = this->pimpl;
      }
      pIVar4->mIOHandler = pIVar3;
      this->pimpl->mIsDefaultHandler = false;
    }
    snprintf(local_118,0xe4,"%s.%s","$$$___magic___$$$",__s);
    ReadFile(this,local_118,pFlags);
    SetIOHandler(this,(IOSystem *)pIOHandler);
    return this->pimpl->mScene;
  }
  std::__cxx11::string::_M_replace
            ((ulong)&this->pimpl->mErrorString,0,
             (char *)(this->pimpl->mErrorString)._M_string_length,0x736865);
  return (aiScene *)0x0;
}

Assistant:

const aiScene* Importer::ReadFileFromMemory( const void* pBuffer,
    size_t pLength,
    unsigned int pFlags,
    const char* pHint /*= ""*/)
{
    ASSIMP_BEGIN_EXCEPTION_REGION();
    if (!pHint) {
        pHint = "";
    }

    if (!pBuffer || !pLength || strlen(pHint) > MaxLenHint ) {
        pimpl->mErrorString = "Invalid parameters passed to ReadFileFromMemory()";
        return NULL;
    }

    // prevent deletion of the previous IOHandler
    IOSystem* io = pimpl->mIOHandler;
    pimpl->mIOHandler = NULL;

    SetIOHandler(new MemoryIOSystem((const uint8_t*)pBuffer,pLength,io));

    // read the file and recover the previous IOSystem
    static const size_t BufSize(Importer::MaxLenHint + 28);
    char fbuff[BufSize];
    ai_snprintf(fbuff, BufSize, "%s.%s",AI_MEMORYIO_MAGIC_FILENAME,pHint);

    ReadFile(fbuff,pFlags);
    SetIOHandler(io);

    ASSIMP_END_EXCEPTION_REGION(const aiScene*);
    return pimpl->mScene;
}